

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

void print_rdebug_grammar(Grammar *g,char *pathname)

{
  uint uVar1;
  ElemKind EVar2;
  Declaration *pDVar3;
  Elem *pEVar4;
  Production *pPVar5;
  Rule *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char *pcVar11;
  char *s;
  char **ppcVar12;
  char *pcVar13;
  Term *pTVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  char ver [30];
  ulong local_88;
  char local_58 [40];
  
  d_version(local_58);
  printf("/*\n  Generated by Make DParser Version %s\n",local_58);
  puts("  Available at http://dparser.sf.net\n*/\n");
  printf("%%<");
  if (g->ncode != 0) {
    bVar7 = true;
    lVar18 = 0;
    uVar16 = 0;
    do {
      printf("%s",*(undefined8 *)((long)&g->code->code + lVar18));
      pcVar11 = strstr(*(char **)((long)&g->code->code + lVar18),"<stdio.h>");
      if (pcVar11 != (char *)0x0) {
        bVar7 = false;
      }
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x10;
    } while (uVar16 < g->ncode);
    if (!bVar7) goto LAB_0013eddd;
  }
  puts("\n  #include <stdio.h>");
LAB_0013eddd:
  printf("%%>\n\n");
  if (g->tokenizer != 0) {
    puts("${declare tokenize}");
  }
  if ((g->declarations).n != 0) {
    uVar16 = 0;
    do {
      pDVar3 = (g->declarations).v[uVar16];
      pEVar4 = pDVar3->elem;
      uVar1 = pDVar3->kind;
      if (uVar1 == 2) {
        if (g->longest_match == 0) {
          pcVar11 = "${declare all_matches}";
          goto LAB_0013eeac;
        }
        pcVar11 = ((pEVar4->e).nterm)->name;
        pcVar13 = "${declare all_matches %s}\n";
LAB_0013ee9e:
        print_declare(pcVar13,pcVar11);
      }
      else if (uVar1 == 1) {
        if (g->longest_match == 0) {
          pcVar11 = ((pEVar4->e).nterm)->name;
          pcVar13 = "${declare longest_match %s}\n";
          goto LAB_0013ee9e;
        }
        pcVar11 = "${declare longest_match}";
LAB_0013eeac:
        puts(pcVar11);
      }
      else {
        printf("\n/*\nDeclaration->kind: %d");
        printf("\nElem->kind:        %d\n*/\n",(ulong)pEVar4->kind);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (g->declarations).n);
  }
  if (g->set_op_priority_from_rule != 0) {
    puts("${declare set_op_priority_from_rule}");
  }
  if (g->states_for_all_nterms != 0) {
    puts("${declare all_subparsers}");
  }
  if (g->default_white_space != (char *)0x0) {
    printf("${declare whitespace %s}\n");
  }
  if (g->save_parse_tree != 0) {
    puts("${declare save_parse_tree}");
  }
  if ((g->scanner).code != (char *)0x0) {
    printf("${scanner %s}\n");
  }
  if ((g->terminals).n != 0) {
    uVar16 = 0;
    bVar7 = false;
    do {
      pTVar14 = (g->terminals).v[uVar16];
      if (pTVar14->kind == TERM_TOKEN) {
        pcVar11 = "";
        if (!bVar7) {
          pcVar11 = "${token";
        }
        printf("%s %s",pcVar11,pTVar14->string);
        bVar7 = true;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (g->terminals).n);
    if (bVar7) {
      puts("}");
    }
  }
  putchar(10);
  uVar1 = (g->productions).n;
  if (uVar1 == 0) {
    printf("/*\n  There were no productions in the grammar %s\n*/\n",pathname);
  }
  else if (uVar1 != 1) {
    uVar16 = 1;
    do {
      pPVar5 = (g->productions).v[uVar16];
      if ((pPVar5->rules).n != 0) {
        local_88 = 0;
        do {
          lVar18 = 0;
          bVar7 = true;
          bVar10 = false;
LAB_0013f021:
          do {
            bVar9 = bVar10;
            bVar8 = bVar7;
            lVar19 = lVar18;
            pRVar6 = (pPVar5->rules).v[local_88];
            if ((local_88 == 0) || (!bVar8)) {
              printf("%s%s%s",*(undefined8 *)(&DAT_00152d90 + lVar19 * 8),pPVar5->name,
                     (&PTR_anon_var_dwarf_a345_00152db0)[lVar19]);
            }
            else {
              printf("%s","\t|   ");
            }
            if ((pRVar6->elems).n != 0) {
              pcVar11 = "\\\"";
              if (bVar8) {
                pcVar11 = "\"";
              }
              pcVar13 = "#";
              if (bVar8) {
                pcVar13 = "$";
              }
              uVar17 = 0;
              do {
                pEVar4 = (pRVar6->elems).v[uVar17];
                EVar2 = pEVar4->kind;
                pTVar14 = (pEVar4->e).term;
                if (EVar2 == ELEM_UNRESOLVED) {
LAB_0013f115:
                  printf("%s ",pTVar14);
                  goto LAB_0013f11c;
                }
                if (EVar2 != ELEM_TERM) {
                  pTVar14 = *(Term **)pTVar14;
                  goto LAB_0013f115;
                }
                if (pTVar14->term_name != (char *)0x0) {
                  printf("%s ");
LAB_0013f0f4:
                  s = (char *)0x0;
                  goto LAB_0013f0f7;
                }
                switch(pTVar14->kind) {
                case TERM_STRING:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string_single_quote(pTVar14->string);
                  }
                  if ((pTVar14->string != (char *)0x0) && (*pTVar14->string != '\0')) {
                    pcVar15 = s;
                    if (!bVar8) {
                      pcVar15 = escape_string_single_quote(s);
                    }
                    printf("\'%s\' ",pcVar15);
                    goto LAB_0013f245;
                  }
                  printf("<EOF> ");
                  break;
                case TERM_REGEX:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar14->string);
                  }
                  pcVar15 = s;
                  if (!bVar8) {
                    pcVar15 = escape_string(s);
                  }
                  printf("%s%s%s ",pcVar11,pcVar15);
LAB_0013f245:
                  if ((pTVar14->field_0x2c & 8) != 0) {
                    printf("/i ");
                  }
                  if (pTVar14->term_priority != 0) {
                    printf("%sterm %d ",pcVar13);
                  }
                  break;
                case TERM_CODE:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar14->string);
                  }
                  pcVar15 = "code(\"%s\") ";
                  goto LAB_0013f1bf;
                case TERM_TOKEN:
                  if (pTVar14->string == (char *)0x0) {
                    s = (char *)0x0;
                  }
                  else {
                    s = escape_string(pTVar14->string);
                  }
                  pcVar15 = "%s ";
LAB_0013f1bf:
                  printf(pcVar15,s);
                  break;
                default:
                  d_fail("unknown token kind");
                  goto LAB_0013f0f4;
                }
LAB_0013f0f7:
                if (s != (char *)0x0) {
                  free(s);
                }
LAB_0013f11c:
                uVar17 = uVar17 + 1;
              } while (uVar17 < (pRVar6->elems).n);
            }
            if (pRVar6->op_assoc != ASSOC_NONE) {
              lVar18 = 0;
              do {
                if (*(AssocKind *)((long)&assoc_strings[0].e + lVar18) == pRVar6->op_assoc) {
                  ppcVar12 = (char **)((long)&assoc_strings[0].s + lVar18);
                  goto LAB_0013f2bb;
                }
                lVar18 = lVar18 + 0x10;
              } while (lVar18 != 0x80);
              ppcVar12 = &assoc_strings[0].s;
LAB_0013f2bb:
              printf(" %s%s ",*(undefined8 *)(&DAT_00152dd0 + lVar19 * 8),*ppcVar12 + 1);
            }
            if (pRVar6->op_priority != 0) {
              printf("%d ");
            }
            if (pRVar6->rule_assoc != ASSOC_NONE) {
              lVar18 = 0;
              do {
                if (*(AssocKind *)((long)&assoc_strings[0].e + lVar18) == pRVar6->rule_assoc) {
                  ppcVar12 = (char **)((long)&assoc_strings[0].s + lVar18);
                  goto LAB_0013f32a;
                }
                lVar18 = lVar18 + 0x10;
              } while (lVar18 != 0x80);
              ppcVar12 = &assoc_strings[0].s;
LAB_0013f32a:
              printf(" %s%s ",*(undefined8 *)(&DAT_00152dd0 + lVar19 * 8),*ppcVar12 + 1);
            }
            if (pRVar6->rule_priority != 0) {
              printf("%d ");
            }
            lVar18 = 1;
            bVar7 = false;
            bVar10 = true;
          } while (((bool)(bVar8 & d_rdebug_grammar_level == 1)) ||
                  (bVar7 = false, (bool)(bVar8 & d_rdebug_grammar_level == 3)));
          if ((bool)(d_rdebug_grammar_level == 3 & bVar9 | bVar8 & d_rdebug_grammar_level == 2)) {
            lVar18 = 2;
            bVar7 = false;
            bVar10 = false;
            if (bVar9) {
              printf("%s","\\n\"); ]");
              bVar7 = false;
              bVar10 = false;
            }
            goto LAB_0013f021;
          }
          printf("%s",&DAT_0014c400 + *(int *)(&DAT_0014c400 + lVar19 * 4));
          local_88 = local_88 + 1;
        } while (local_88 < (pPVar5->rules).n);
      }
      puts("\t;");
      putchar(10);
      uVar16 = uVar16 + 1;
    } while (uVar16 < (g->productions).n);
  }
  return;
}

Assistant:

void print_rdebug_grammar(Grammar *g, char *pathname) {
  char ver[30];
  d_version(ver);

  printf("/*\n  Generated by Make DParser Version %s\n", ver);
  printf("  Available at http://dparser.sf.net\n*/\n\n");

  print_global_code(g);
  print_declarations(g);
  print_productions(g, pathname);
}